

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

void ParserContext_Init(parsercontext *p,nodemeta *Custom,cc_memheap *Heap,cc_memheap *ConstHeap)

{
  charconv *pcVar1;
  cc_memheap *ConstHeap_local;
  cc_memheap *Heap_local;
  nodemeta *Custom_local;
  parsercontext *p_local;
  
  NodeContext_Init(&p->Base,Custom,Heap,ConstHeap);
  (p->Base).ExternalStr = ExternalStr;
  StrTab_Init(&p->StrTab,(p->Base).NodeConstHeap,0x1400);
  pcVar1 = CharConvOpen((tchar_t *)0x0,"UTF-8");
  p->ToUTF8 = pcVar1;
  pcVar1 = CharConvOpen("UTF-8",(tchar_t *)0x0);
  p->FromUTF8 = pcVar1;
  pcVar1 = CharConvOpen((tchar_t *)0x0,"");
  p->ToStr = pcVar1;
  pcVar1 = CharConvOpen("",(tchar_t *)0x0);
  p->FromStr = pcVar1;
  pcVar1 = CharConvOpen((tchar_t *)0x0,"UTF-32");
  p->ToWcs = pcVar1;
  pcVar1 = CharConvOpen("UTF-32",(tchar_t *)0x0);
  p->FromWcs = pcVar1;
  pcVar1 = CharConvOpen((tchar_t *)0x0,"UTF-16");
  p->ToUtf16 = pcVar1;
  pcVar1 = CharConvOpen("UTF-16",(tchar_t *)0x0);
  p->FromUtf16 = pcVar1;
  NodeRegisterClassEx((nodemodule *)p,LangStr_Class);
  CoreC_FileInit((nodemodule *)p);
  return;
}

Assistant:

void ParserContext_Init(parsercontext* p,const nodemeta* Custom, const cc_memheap* Heap, const cc_memheap* ConstHeap)
{
    NodeContext_Init(&p->Base,Custom,Heap,ConstHeap);
    p->Base.ExternalStr = ExternalStr;
    StrTab_Init(&p->StrTab,p->Base.NodeConstHeap,5120);
    p->ToUTF8    = CharConvOpen(NULL,CHARSET_UTF8);
    p->FromUTF8  = CharConvOpen(CHARSET_UTF8,NULL);
    p->ToStr     = CharConvOpen(NULL,CHARSET_DEFAULT);
    p->FromStr   = CharConvOpen(CHARSET_DEFAULT,NULL);
    p->ToWcs     = CharConvOpen(NULL,CHARSET_WCHAR);
    p->FromWcs   = CharConvOpen(CHARSET_WCHAR,NULL);
    p->ToUtf16   = CharConvOpen(NULL,CHARSET_UTF16);
    p->FromUtf16 = CharConvOpen(CHARSET_UTF16,NULL);

    NodeRegisterClassEx(&p->Base.Base,LangStr_Class);
    CoreC_FileInit(&p->Base.Base);
}